

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O3

uint __thiscall
BTree<StringBTree,_StringKey>::searchByKey(BTree<StringBTree,_StringKey> *this,StringKey *key)

{
  byte bVar1;
  uint *puVar2;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  KeyCompareOp in_R9;
  uint count;
  SearchResult result;
  SearchResult local_50;
  code *local_40;
  undefined8 uStack_38;
  
  puVar2 = (uint *)this->m_data;
  uVar9 = *puVar2;
  count = (uint)(byte)*puVar2;
  local_50.lowerBound = 0;
  local_50.upperBound = 0;
  local_50.index = 0xffffffff;
  local_50.maxIndex = 0;
  pbVar7 = (byte *)((long)puVar2 +
                   (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8));
  if ((byte)*puVar2 != 0) {
    pbVar4 = (byte *)0x0;
    uVar9 = count;
    do {
      local_40 = StringBTree::lessThanKeyCompareOp;
      uStack_38 = 0;
      pbVar7 = searchWithComparison(this,&local_50,pbVar7,count,key,in_R9);
      if (pbVar7 == (byte *)0x0) goto LAB_0011da9c;
      uVar10 = (ulong)*pbVar7;
      pbVar3 = pbVar7 + 1;
      if ((char)*pbVar7 < '\0') {
        uVar8 = 0x80;
        do {
          bVar1 = *pbVar3;
          lVar5 = uVar10 - uVar8;
          pbVar3 = pbVar3 + 1;
          uVar8 = uVar8 << 7;
          uVar6 = lVar5 * 0x100;
          uVar10 = bVar1 | uVar6;
        } while ((uVar6 & uVar8) != 0);
      }
      local_50.maxIndex = (uint)uVar10;
      uVar10 = (ulong)*pbVar3;
      if ((char)*pbVar3 < '\0') {
        uVar8 = 0x80;
        do {
          pbVar7 = pbVar3 + 1;
          lVar5 = uVar10 - uVar8;
          pbVar3 = pbVar3 + 1;
          uVar8 = uVar8 << 7;
          uVar6 = lVar5 * 0x100;
          uVar10 = *pbVar7 | uVar6;
        } while ((uVar6 & uVar8) != 0);
      }
      uVar8 = (ulong)pbVar3[(uVar10 & 0xffffffff) + 1];
      if ((char)pbVar3[(uVar10 & 0xffffffff) + 1] < '\0') {
        pbVar3 = pbVar3 + (uVar10 & 0xffffffff) + 2;
        uVar10 = 0x80;
        do {
          bVar1 = *pbVar3;
          lVar5 = uVar8 - uVar10;
          uVar10 = uVar10 << 7;
          pbVar3 = pbVar3 + 1;
          uVar6 = lVar5 * 0x100;
          uVar8 = bVar1 | uVar6;
        } while ((uVar6 & uVar10) != 0);
      }
      pbVar7 = this->m_data + (uVar8 & 0xffffffff);
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  local_40 = StringBTree::equalKeyCompareOp;
  uStack_38 = 0;
  pbVar4 = searchWithComparison(this,&local_50,pbVar7,0,key,in_R9);
LAB_0011da9c:
  if (count == 0) {
    local_50._0_8_ = local_50._0_8_ & 0xffffffff;
  }
  if (pbVar4 == (byte *)0x0) {
    local_50.lowerBound = 0xffffffff;
  }
  else {
    uVar10 = (ulong)*pbVar4;
    pbVar7 = pbVar4 + 1;
    if ((char)*pbVar4 < '\0') {
      uVar8 = 0x80;
      do {
        bVar1 = *pbVar7;
        lVar5 = uVar10 - uVar8;
        pbVar7 = pbVar7 + 1;
        uVar8 = uVar8 << 7;
        uVar6 = lVar5 * 0x100;
        uVar10 = bVar1 | uVar6;
      } while ((uVar6 & uVar8) != 0);
    }
    local_50.lowerBound = (local_50.maxIndex - local_50.upperBound) + local_50.lowerBound;
    key->m_length = (uint)uVar10;
    key->m_value = (char *)pbVar7;
  }
  return local_50.lowerBound;
}

Assistant:

unsigned int searchByKey(Key& key) const
	{
		const auto& self = static_cast<const Derived&>(*this);
		
		const auto count = static_cast<unsigned int>(readAtWithByteSwap<uint8_t>(m_data, 0));
		const auto offset = readAtWithByteSwap<uint32_t>(m_data, 0) & UINT32_C(0xFFFFFF);
		
		auto data = advancePointer(m_data, offset);
		SearchResult result;
		for (auto i = count; i != 0; i--) {
			data = searchWithComparison(result, data, count, key, &Derived::lessThanKeyCompareOp);
			if (!data)
				goto done;
			
			result.maxIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			
			data = self.advanceData(data);
			
			const auto nextOffset = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			data = advancePointer(m_data, nextOffset);
		}
		
		data = searchWithComparison(result, data, 0, key, &Derived::equalKeyCompareOp);

	done:
		if (count == 0)
			result.upperBound = 0;
			
		if (data) {
			const auto index = (result.maxIndex - result.upperBound + result.lowerBound);
			self.parseData(key, data);
			return index;
		} else {
			return INVALID_INDEX;
		}
	}